

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::Help::Help(Help *this,bool throwExceptionOnPrint)

{
  byte in_SIL;
  undefined8 *in_RDI;
  String *in_stack_ffffffffffffff68;
  allocator *desc;
  HelpPrinter *in_stack_ffffffffffffff70;
  Arg *this_00;
  allocator local_69;
  string local_68 [39];
  undefined1 local_41 [15];
  bool in_stack_ffffffffffffffce;
  bool in_stack_ffffffffffffffcf;
  char (*in_stack_ffffffffffffffd0) [5];
  Char in_stack_ffffffffffffffdf;
  Arg *in_stack_ffffffffffffffe0;
  
  Arg::Arg<char_const(&)[5]>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce);
  *in_RDI = &PTR__Help_00188a48;
  operator_new(0x58);
  HelpPrinter::HelpPrinter(in_stack_ffffffffffffff70);
  std::unique_ptr<Args::HelpPrinterIface,std::default_delete<Args::HelpPrinterIface>>::
  unique_ptr<std::default_delete<Args::HelpPrinterIface>,void>
            ((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_> *)
             in_stack_ffffffffffffff70,(pointer)in_stack_ffffffffffffff68);
  *(byte *)(in_RDI + 0x20) = in_SIL & 1;
  this_00 = (Arg *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"Print this help.",(allocator *)this_00);
  Arg::setDescription(this_00,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  desc = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Print this help.",desc);
  Arg::setLongDescription(this_00,(String *)desc);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

inline
Help::Help( bool throwExceptionOnPrint )
	:	Arg( SL( 'h' ), SL( "help" ), true, false )
	,	m_printer( new HelpPrinter )
	,	m_throwExceptionOnPrint( throwExceptionOnPrint )
{
	setDescription( SL( "Print this help." ) );
	setLongDescription( SL( "Print this help." ) );
}